

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O0

Debug * Corrade::Utility::operator<<(Debug *debug,Flags value)

{
  Debug *pDVar1;
  size_type in_R9;
  initializer_list<Corrade::Utility::Debug::Flag> enums;
  char local_36 [6];
  char *local_30;
  undefined8 local_28;
  UnderlyingType local_19;
  Debug *local_18;
  Debug *debug_local;
  Flags value_local;
  
  local_36[0] = '\x01';
  local_36[1] = 2;
  local_36[2] = 4;
  local_36[3] = 8;
  local_36[4] = 0x10;
  local_36[5] = 0x80;
  local_30 = local_36;
  local_28 = 6;
  enums._M_len = in_R9;
  enums._M_array = (iterator)0x6;
  local_19 = value._value;
  local_18 = debug;
  debug_local._7_1_ = value._value;
  pDVar1 = Containers::enumSetDebugOutput<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_>
                     ((Containers *)debug,(Debug *)(ulong)value._value,
                      (EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_>)0xa,local_30,
                      enums);
  return pDVar1;
}

Assistant:

Debug& operator<<(Debug& debug, Debug::Flags value) {
    return Containers::enumSetDebugOutput(debug, value, "Utility::Debug::Flags{}", {
        Debug::Flag::NoNewlineAtTheEnd,
        Debug::Flag::DisableColors,
        Debug::Flag::NoSpace,
        Debug::Flag::Packed,
        Debug::Flag::Color,
        /* Space reserved for Bin and Oct */
        Debug::Flag::Hex});
}